

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::Statistics::Statistics(Statistics *this,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0xb) = in_ESI;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  *in_RDI = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[1] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[2] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[3] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[4] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[5] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[6] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[7] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[8] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[9] = pTVar1;
  pTVar1 = TimerFactory::createTimer(this._4_4_);
  in_RDI[10] = pTVar1;
  clearAllData((Statistics *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

SoPlexBase<R>::Statistics::Statistics(Timer::TYPE ttype)
{
   timerType = ttype;
   readingTime = TimerFactory::createTimer(timerType);
   solvingTime = TimerFactory::createTimer(timerType);
   preprocessingTime = TimerFactory::createTimer(timerType);
   simplexTime = TimerFactory::createTimer(timerType);
   syncTime = TimerFactory::createTimer(timerType);
   transformTime = TimerFactory::createTimer(timerType);
   rationalTime = TimerFactory::createTimer(timerType);
   initialPrecisionTime = TimerFactory::createTimer(timerType);
   extendedPrecisionTime = TimerFactory::createTimer(timerType);
   reconstructionTime = TimerFactory::createTimer(timerType);
   boostingStepTime = TimerFactory::createTimer(timerType);
   clearAllData();
}